

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearSegmentParameter.cpp
# Opt level: O3

int __thiscall DIS::LinearSegmentParameter::getMarshalledSize(LinearSegmentParameter *this)

{
  int iVar1;
  int iVar2;
  
  iVar1 = Vector3Double::getMarshalledSize(&this->_segmentLocation);
  iVar2 = EulerAngles::getMarshalledSize(&this->_segmentOrientation);
  return iVar2 + iVar1 + 0xe;
}

Assistant:

int LinearSegmentParameter::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 1;  // _segmentNumber
   marshalSize = marshalSize + 1;  // _segmentModification
   marshalSize = marshalSize + 2;  // _generalSegmentAppearance
   marshalSize = marshalSize + 2;  // _specificSegmentAppearance
   marshalSize = marshalSize + _segmentLocation.getMarshalledSize();  // _segmentLocation
   marshalSize = marshalSize + _segmentOrientation.getMarshalledSize();  // _segmentOrientation
   marshalSize = marshalSize + 2;  // _segmentLength
   marshalSize = marshalSize + 2;  // _segmentWidth
   marshalSize = marshalSize + 2;  // _segmentHeight
   marshalSize = marshalSize + 2;  // _segmentDepth
    return marshalSize;
}